

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t process_head_main(archive_read *a,rar5 *rar,archive_entry *entry,size_t block_flags)

{
  wchar_t wVar1;
  size_t local_60;
  size_t v;
  size_t archive_flags;
  size_t extra_field_id;
  size_t extra_field_size;
  size_t extra_data_size;
  size_t sStack_30;
  wchar_t ret;
  size_t block_flags_local;
  archive_entry *entry_local;
  rar5 *rar_local;
  archive_read *a_local;
  
  extra_field_size = 0;
  extra_field_id = 0;
  archive_flags = 0;
  v = 0;
  sStack_30 = block_flags;
  block_flags_local = (size_t)entry;
  entry_local = (archive_entry *)rar;
  rar_local = (rar5 *)a;
  if ((block_flags & 1) == 0) {
    extra_field_size = 0;
  }
  else {
    wVar1 = read_var_sized(a,&extra_field_size,(size_t *)0x0);
    if (wVar1 == L'\0') {
      return L'\x01';
    }
  }
  wVar1 = read_var_sized((archive_read *)rar_local,&v,(size_t *)0x0);
  if (wVar1 == L'\0') {
    return L'\x01';
  }
  *(byte *)((long)&(entry_local->ae_stat).aest_ctime + 4) =
       *(byte *)((long)&(entry_local->ae_stat).aest_ctime + 4) & 0xfd | ((v & 1) != 0) << 1;
  *(byte *)((long)&(entry_local->ae_stat).aest_ctime + 4) =
       *(byte *)((long)&(entry_local->ae_stat).aest_ctime + 4) & 0xfe | (v & 4) != 0;
  if ((v & 2) == 0) {
    (entry_local->ae_stat).aest_ctime_nsec = 0;
  }
  else {
    local_60 = 0;
    wVar1 = read_var_sized((archive_read *)rar_local,&local_60,(size_t *)0x0);
    if (wVar1 == L'\0') {
      return L'\x01';
    }
    if (0xffffffff < local_60) {
      archive_set_error((archive *)rar_local,0x54,"Invalid volume number");
      return L'\xffffffe2';
    }
    (entry_local->ae_stat).aest_ctime_nsec = (uint32_t)local_60;
  }
  if (((int)entry_local[0x10].ae_uname.aes_wcs.length == 0) ||
     ((entry_local->ae_stat).aest_ctime_nsec == (uint32_t)entry_local[0x10].ae_uname.aes_wcs.length)
     ) {
    if (extra_field_size == 0) {
      a_local._4_4_ = L'\0';
    }
    else {
      wVar1 = read_var_sized((archive_read *)rar_local,&extra_field_id,(size_t *)0x0);
      if (wVar1 == L'\0') {
        a_local._4_4_ = L'\x01';
      }
      else {
        wVar1 = read_var_sized((archive_read *)rar_local,&archive_flags,(size_t *)0x0);
        if (wVar1 == L'\0') {
          a_local._4_4_ = L'\x01';
        }
        else if (extra_field_id == 0) {
          archive_set_error((archive *)rar_local,0x54,"Invalid extra field size");
          a_local._4_4_ = L'\xffffffe2';
        }
        else if (archive_flags == 1) {
          a_local._4_4_ =
               process_main_locator_extra_block((archive_read *)rar_local,(rar5 *)entry_local);
          if (a_local._4_4_ == L'\0') {
            a_local._4_4_ = L'\0';
          }
        }
        else {
          archive_set_error((archive *)rar_local,0x54,"Unsupported extra type (0x%x)",
                            archive_flags & 0xffffffff);
          a_local._4_4_ = L'\xffffffe2';
        }
      }
    }
  }
  else {
    a_local._4_4_ = L'\x01';
  }
  return a_local._4_4_;
}

Assistant:

static int process_head_main(struct archive_read* a, struct rar5* rar,
    struct archive_entry* entry, size_t block_flags)
{
	int ret;
	size_t extra_data_size = 0;
	size_t extra_field_size = 0;
	size_t extra_field_id = 0;
	size_t archive_flags = 0;

	enum MAIN_FLAGS {
		VOLUME = 0x0001,         /* multi-volume archive */
		VOLUME_NUMBER = 0x0002,  /* volume number, first vol doesn't
					  * have it */
		SOLID = 0x0004,          /* solid archive */
		PROTECT = 0x0008,        /* contains Recovery info */
		LOCK = 0x0010,           /* readonly flag, not used */
	};

	enum MAIN_EXTRA {
		// Just one attribute here.
		LOCATOR = 0x01,
	};

	(void) entry;

	if(block_flags & HFL_EXTRA_DATA) {
		if(!read_var_sized(a, &extra_data_size, NULL))
			return ARCHIVE_EOF;
	} else {
		extra_data_size = 0;
	}

	if(!read_var_sized(a, &archive_flags, NULL)) {
		return ARCHIVE_EOF;
	}

	rar->main.volume = (archive_flags & VOLUME) > 0;
	rar->main.solid = (archive_flags & SOLID) > 0;

	if(archive_flags & VOLUME_NUMBER) {
		size_t v = 0;
		if(!read_var_sized(a, &v, NULL)) {
			return ARCHIVE_EOF;
		}

		if (v > UINT_MAX) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Invalid volume number");
			return ARCHIVE_FATAL;
		}

		rar->main.vol_no = (unsigned int) v;
	} else {
		rar->main.vol_no = 0;
	}

	if(rar->vol.expected_vol_no > 0 &&
		rar->main.vol_no != rar->vol.expected_vol_no)
	{
		/* Returning EOF instead of FATAL because of strange
		 * libarchive behavior. When opening multiple files via
		 * archive_read_open_filenames(), after reading up the whole
		 * last file, the __archive_read_ahead function wraps up to
		 * the first archive instead of returning EOF. */
		return ARCHIVE_EOF;
	}

	if(extra_data_size == 0) {
		/* Early return. */
		return ARCHIVE_OK;
	}

	if(!read_var_sized(a, &extra_field_size, NULL)) {
		return ARCHIVE_EOF;
	}

	if(!read_var_sized(a, &extra_field_id, NULL)) {
		return ARCHIVE_EOF;
	}

	if(extra_field_size == 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Invalid extra field size");
		return ARCHIVE_FATAL;
	}

	switch(extra_field_id) {
		case LOCATOR:
			ret = process_main_locator_extra_block(a, rar);
			if(ret != ARCHIVE_OK) {
				/* Error while parsing main locator extra
				 * block. */
				return ret;
			}

			break;
		default:
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Unsupported extra type (0x%x)",
			    (int) extra_field_id);
			return ARCHIVE_FATAL;
	}

	return ARCHIVE_OK;
}